

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QTable.cpp
# Opt level: O2

void __thiscall QTable::SetToZero(QTable *this)

{
  size_type sVar1;
  size_type sVar2;
  size_t s;
  ulong uVar3;
  size_t a;
  ulong uVar4;
  
  sVar1 = (this->super_matrix_t).size1_;
  sVar2 = (this->super_matrix_t).size2_;
  for (uVar3 = 0; uVar3 != sVar1; uVar3 = uVar3 + 1) {
    for (uVar4 = 0; sVar2 != uVar4; uVar4 = uVar4 + 1) {
      (*(this->super_QTableInterface)._vptr_QTableInterface[1])
                (0,this,uVar3 & 0xffffffff,uVar4 & 0xffffffff);
    }
  }
  return;
}

Assistant:

void QTable::SetToZero()
{
    size_t nrRows=this->size1(),
        nrColumns=this->size2();
   
    for(size_t s=0;s!=nrRows;++s)
        for(size_t a=0;a!=nrColumns;++a)
            Set(s,a,0.0);
}